

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O3

void __thiscall jbcoin::STArray::STArray(STArray *this,SField *f)

{
  atomic<int> *paVar1;
  Counter *pCVar2;
  
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d3040;
  (this->super_STBase).fName = f;
  pCVar2 = CountedObject<jbcoin::STArray>::getCounter();
  LOCK();
  paVar1 = &(pCVar2->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STArray_002d2f58;
  (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::reserve(&this->v_,8);
  return;
}

Assistant:

STArray::STArray (SField const& f)
    : STBase (f)
{
    v_.reserve(reserveSize);
}